

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O0

char * TranslateADIOS2Type2FFS(int Type)

{
  undefined4 in_EDI;
  char *local_8;
  
  switch(in_EDI) {
  case 1:
  case 2:
  case 3:
  case 4:
    local_8 = strdup("integer");
    break;
  case 5:
  case 6:
  case 7:
  case 8:
    local_8 = strdup("unsigned integer");
    break;
  case 9:
  case 10:
    local_8 = strdup("float");
    break;
  default:
    local_8 = (char *)0x0;
    break;
  case 0xc:
    local_8 = strdup("complex4");
    break;
  case 0xd:
    local_8 = strdup("complex8");
    break;
  case 0xe:
    local_8 = strdup("string");
  }
  return local_8;
}

Assistant:

static char *TranslateADIOS2Type2FFS(const int Type)
{
    switch (Type)
    {
    case Int8:
    case Int16:
    case Int32:
    case Int64:
        return strdup("integer");
    case UInt8:
    case UInt16:
    case UInt32:
    case UInt64:
        return strdup("unsigned integer");
    case Float:
    case Double:
        return strdup("float");
    case FloatComplex:
        return strdup("complex4");
    case DoubleComplex:
        return strdup("complex8");
    case String:
        return strdup("string");
    }
    return 0;
}